

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test3::writeVaryingPassthrough
          (GPUShaderFP64Test3 *this,ostream *stream,shaderStage shader_stage)

{
  ostream *poVar1;
  shaderStage shader_stage_local;
  ostream *stream_local;
  GPUShaderFP64Test3 *this_local;
  
  switch(shader_stage) {
  case FRAGMENT_SHADER:
    break;
  case GEOMETRY_SHADER:
    poVar1 = std::operator<<(stream,"    ");
    poVar1 = std::operator<<(poVar1,m_varying_name_gs_fs_tcs_result);
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = std::operator<<(poVar1,m_varying_name_tes_gs_tcs_result);
    std::operator<<(poVar1,"[0];\n");
    poVar1 = std::operator<<(stream,"    ");
    poVar1 = std::operator<<(poVar1,m_varying_name_gs_fs_tes_result);
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = std::operator<<(poVar1,m_varying_name_tes_gs_tes_result);
    std::operator<<(poVar1,"[0];\n");
    poVar1 = std::operator<<(stream,"    ");
    poVar1 = std::operator<<(poVar1,m_varying_name_gs_fs_vs_result);
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = std::operator<<(poVar1,m_varying_name_tes_gs_vs_result);
    std::operator<<(poVar1,"[0];\n");
    break;
  case TESS_CONTROL_SHADER:
    poVar1 = std::operator<<(stream,"    ");
    poVar1 = std::operator<<(poVar1,m_varying_name_tcs_tes_vs_result);
    poVar1 = std::operator<<(poVar1,"[gl_InvocationID] = ");
    poVar1 = std::operator<<(poVar1,m_varying_name_vs_tcs_vs_result);
    std::operator<<(poVar1,"[0];\n");
    break;
  case TESS_EVAL_SHADER:
    poVar1 = std::operator<<(stream,"    ");
    poVar1 = std::operator<<(poVar1,m_varying_name_tes_gs_tcs_result);
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = std::operator<<(poVar1,m_varying_name_tcs_tes_tcs_result);
    std::operator<<(poVar1,"[0];\n");
    poVar1 = std::operator<<(stream,"    ");
    poVar1 = std::operator<<(poVar1,m_varying_name_tes_gs_vs_result);
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = std::operator<<(poVar1,m_varying_name_tcs_tes_vs_result);
    std::operator<<(poVar1,"[0];\n");
    break;
  case VERTEX_SHADER:
  }
  return;
}

Assistant:

void GPUShaderFP64Test3::writeVaryingPassthrough(std::ostream& stream, shaderStage shader_stage) const
{
	switch (shader_stage)
	{
	case FRAGMENT_SHADER:
		break;

	case GEOMETRY_SHADER:

		stream << "    " << m_varying_name_gs_fs_tcs_result << " = " << m_varying_name_tes_gs_tcs_result << "[0];\n";
		stream << "    " << m_varying_name_gs_fs_tes_result << " = " << m_varying_name_tes_gs_tes_result << "[0];\n";
		stream << "    " << m_varying_name_gs_fs_vs_result << " = " << m_varying_name_tes_gs_vs_result << "[0];\n";

		break;

	case TESS_CONTROL_SHADER:

		stream << "    " << m_varying_name_tcs_tes_vs_result
			   << "[gl_InvocationID] = " << m_varying_name_vs_tcs_vs_result << "[0];\n";

		break;

	case TESS_EVAL_SHADER:

		stream << "    " << m_varying_name_tes_gs_tcs_result << " = " << m_varying_name_tcs_tes_tcs_result << "[0];\n";
		stream << "    " << m_varying_name_tes_gs_vs_result << " = " << m_varying_name_tcs_tes_vs_result << "[0];\n";

		break;

	case VERTEX_SHADER:

		break;
	}
}